

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O3

void __thiscall cursespp::ListOverlay::Layout(ListOverlay *this)

{
  Layout((ListOverlay *)
         &this[-1].super_has_slots<sigslot::multi_threaded_local>.m_senders._M_t._M_impl.
          super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void ListOverlay::Layout() {
    this->RecalculateSize();

    if (this->width > 0 && this->height > 0) {
        this->MoveAndResize(
            this->x,
            this->y,
            this->width,
            this->height);

        bool scrollbar = this->ScrollbarVisible();
        auto contentWidth = this->GetContentWidth() - 2; /* subtract padding */
        auto contentHeight = this->height - 4; /* top and bottom padding + title */
        auto startX = 1; /* L padding */
        auto startY = 2; /* below the title, plus an extra space */
        auto listWidth = scrollbar ? contentWidth - 2 : contentWidth;

        this->listWindow->MoveAndResize(startX, startY, listWidth, contentHeight);

        auto index = this->listWindow->GetSelectedIndex();
        if (!this->listWindow->IsEntryVisible(index)) {
            this->listWindow->ScrollTo(index);
        }

        if (scrollbar) {
            this->scrollbar->Show();
            this->scrollbar->MoveAndResize(contentWidth, startY, 1, contentHeight);
        }
        else {
            this->scrollbar->Hide();
        }

        this->UpdateContents();
    }
}